

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::CamelCaseFieldName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FieldDescriptor *field)

{
  string local_90;
  AlphaNum local_70;
  undefined8 local_40;
  char *local_38;
  
  UnderscoresToCamelCase_abi_cxx11_(&local_90,this,field);
  if ((byte)(*local_90._M_dataplus._M_p - 0x30U) < 10) {
    local_40 = 1;
    local_38 = "_";
    local_70.piece_._M_len = local_90._M_string_length;
    local_70.piece_._M_str = local_90._M_dataplus._M_p;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_40,&local_70,
               (AlphaNum *)local_90._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_90.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_90.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_90._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_90.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_90._M_string_length;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CamelCaseFieldName(const FieldDescriptor* field) {
  std::string fieldName = UnderscoresToCamelCase(field);
  if ('0' <= fieldName[0] && fieldName[0] <= '9') {
    return absl::StrCat("_", fieldName);
  }
  return fieldName;
}